

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int get_message(mg_connection *conn,char *ebuf,size_t ebuf_len,int *err)

{
  char *pcVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  char *__nptr;
  char *pcVar6;
  double local_58;
  timespec local_48;
  
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  *err = 0;
  if (conn == (mg_connection *)0x0) {
LAB_0011a29e:
    pcVar6 = "Internal error";
    conn = (mg_connection *)0x0;
  }
  else {
    conn->consumed_content = 0;
    conn->num_bytes_sent = 0;
    conn->path_info = (char *)0x0;
    conn->must_close = 0;
    conn->accept_gzip = 0;
    conn->status_code = -1;
    conn->throttle = 0;
    lVar4 = -1;
    conn->content_len = -1;
    conn->is_chunked = 0;
    conn->request_len = 0;
    conn->request_state = 0;
    (conn->request_info).content_length = -1;
    (conn->response_info).content_length = -1;
    (conn->request_info).http_version = (char *)0x0;
    (conn->request_info).num_headers = 0;
    (conn->response_info).num_headers = 0;
    (conn->response_info).status_code = 0;
    (conn->request_info).remote_user = (char *)0x0;
    (conn->request_info).request_method = (char *)0x0;
    (conn->request_info).request_uri = (char *)0x0;
    (conn->response_info).status_text = (char *)0x0;
    (conn->response_info).http_version = (char *)0x0;
    pcVar6 = (conn->request_info).local_uri;
    if (pcVar6 != (conn->request_info).local_uri_raw) {
      free(pcVar6);
      (conn->request_info).local_uri = (char *)0x0;
    }
    (conn->request_info).local_uri = (char *)0x0;
    if (conn == (mg_connection *)0x0) goto LAB_0011a29e;
    clock_gettime(1,(timespec *)&conn->req_time);
    pcVar6 = conn->buf;
    iVar5 = conn->buf_size;
    local_48.tv_sec = 0;
    local_48.tv_nsec = 0;
    pcVar1 = conn->dom_ctx->config[0xb];
    __nptr = "30000";
    if (pcVar1 != (char *)0x0) {
      __nptr = pcVar1;
    }
    local_58 = strtod(__nptr,(char **)0x0);
    if ((0 < conn->handled_requests) && (pcVar1 = conn->dom_ctx->config[0xc], pcVar1 != (char *)0x0)
       ) {
      local_58 = strtod(pcVar1,(char **)0x0);
    }
    iVar3 = get_http_header_len(pcVar6,conn->data_len);
    if (iVar3 == 0) {
      if (conn->phys_ctx->stop_flag == 0) {
        local_58 = local_58 / 1000.0;
        do {
          iVar3 = conn->data_len;
          if (iVar5 <= iVar3) {
            iVar3 = -2;
            goto LAB_0011a26e;
          }
          iVar3 = pull_inner((FILE *)conn,(mg_connection *)(pcVar6 + iVar3),
                             (char *)(ulong)(uint)(iVar5 - iVar3),(int)lVar4,local_58);
          if (iVar3 == -2) break;
          clock_gettime(1,&local_48);
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          else {
            iVar3 = iVar3 + conn->data_len;
            conn->data_len = iVar3;
            iVar3 = get_http_header_len(pcVar6,iVar3);
          }
          if ((iVar3 != 0) || (local_58 < 0.0)) {
            if (iVar3 != 0) goto LAB_0011a26e;
          }
          else {
            lVar4 = local_48.tv_sec - (conn->req_time).tv_sec;
            dVar2 = (double)(local_48.tv_nsec - (conn->req_time).tv_nsec) * 1e-09 + (double)lVar4;
            if (local_58 < dVar2) {
              if (local_58 < dVar2) {
                iVar3 = -1;
              }
              goto LAB_0011a26e;
            }
          }
        } while (conn->phys_ctx->stop_flag == 0);
      }
      iVar3 = -1;
    }
LAB_0011a26e:
    conn->request_len = iVar3;
    if ((iVar3 < 0) || (iVar3 <= conn->data_len)) {
      if (0 < iVar3) {
        return 1;
      }
      if (conn->data_len < 1) {
        conn->must_close = 1;
        iVar5 = 0;
        pcVar6 = "No data received";
      }
      else {
        iVar5 = 400;
        pcVar6 = "Malformed message";
      }
      mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s",pcVar6);
      goto LAB_0011a2c2;
    }
    pcVar6 = "Invalid message size";
  }
  mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s",pcVar6);
  iVar5 = 500;
LAB_0011a2c2:
  *err = iVar5;
  return 0;
}

Assistant:

static int
get_message(struct mg_connection *conn, char *ebuf, size_t ebuf_len, int *err)
{
	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}
	*err = 0;

	reset_per_request_attributes(conn);

	if (!conn) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Internal error");
		*err = 500;
		return 0;
	}

	/* Set the time the request was received. This value should be used for
	 * timeouts. */
	clock_gettime(CLOCK_MONOTONIC, &(conn->req_time));

	conn->request_len =
	    read_message(NULL, conn, conn->buf, conn->buf_size, &conn->data_len);
	DEBUG_ASSERT(conn->request_len < 0 || conn->data_len >= conn->request_len);
	if ((conn->request_len >= 0) && (conn->data_len < conn->request_len)) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Invalid message size");
		*err = 500;
		return 0;
	}

	if ((conn->request_len == 0) && (conn->data_len == conn->buf_size)) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Message too large");
		*err = 413;
		return 0;
	}

	if (conn->request_len <= 0) {
		if (conn->data_len > 0) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Malformed message");
			*err = 400;
		} else {
			/* Server did not recv anything -> just close the connection */
			conn->must_close = 1;
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "No data received");
			*err = 0;
		}
		return 0;
	}
	return 1;
}